

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O2

UBool icu_63::compareRules(UVector *rules1,UVector *rules2)

{
  uint uVar1;
  UBool UVar2;
  char cVar3;
  uint index;
  uint uVar4;
  long *plVar5;
  void *pvVar6;
  uint uVar7;
  
  UVar2 = '\x01';
  if (rules1 != (UVector *)0x0 || rules2 != (UVector *)0x0) {
    if (rules1 == (UVector *)0x0 || rules2 == (UVector *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar1 = rules1->count;
      uVar4 = 0;
      if (uVar1 == rules2->count) {
        uVar7 = 0;
        if (0 < (int)uVar1) {
          uVar7 = uVar1;
        }
        do {
          index = uVar4;
          if (uVar7 == index) break;
          plVar5 = (long *)UVector::elementAt(rules1,index);
          pvVar6 = UVector::elementAt(rules2,index);
          cVar3 = (**(code **)(*plVar5 + 0x28))(plVar5,pvVar6);
          uVar4 = index + 1;
        } while (cVar3 == '\0');
        uVar4 = (uint)((int)uVar1 <= (int)index);
      }
    }
    UVar2 = (UBool)uVar4;
  }
  return UVar2;
}

Assistant:

static UBool compareRules(UVector* rules1, UVector* rules2) {
    if (rules1 == NULL && rules2 == NULL) {
        return TRUE;
    } else if (rules1 == NULL || rules2 == NULL) {
        return FALSE;
    }
    int32_t size = rules1->size();
    if (size != rules2->size()) {
        return FALSE;
    }
    for (int32_t i = 0; i < size; i++) {
        TimeZoneRule *r1 = (TimeZoneRule*)rules1->elementAt(i);
        TimeZoneRule *r2 = (TimeZoneRule*)rules2->elementAt(i);
        if (*r1 != *r2) {
            return FALSE;
        }
    }
    return TRUE;
}